

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O2

void __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::assign
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,size_type n,uchar *val)

{
  long lVar1;
  uint uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  clear(this);
  if (this->_size < 0x11) {
    uVar2 = 0x10;
  }
  else {
    uVar2 = (this->_union).indirect_contents.capacity;
  }
  if (uVar2 < n) {
    change_capacity(this,n);
    uVar2 = this->_size + n;
    this->_size = uVar2;
  }
  else {
    uVar2 = this->_size + n;
    this->_size = uVar2;
    if (n == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_0018e733;
    }
  }
  if (0x10 < uVar2) {
    this = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
           (this->_union).indirect_contents.indirect;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    memset(this,(uint)*val,(ulong)n);
    return;
  }
LAB_0018e733:
  __stack_chk_fail();
}

Assistant:

void assign(size_type n, const T& val) {
        clear();
        if (capacity() < n) {
            change_capacity(n);
        }
        _size += n;
        fill(item_ptr(0), n, val);
    }